

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O0

void Opal_Port(Opal *self,uint16_t reg_num,uint8_t val)

{
  OpalOperator *self_00;
  ushort uVar1;
  uint uVar2;
  OpalChannel *self_01;
  uint local_6c;
  OpalOperator *op;
  OpalChannel *pOStack_58;
  uint16_t type;
  OpalChannel *chans [2];
  OpalChannel *cchan;
  OpalChannel *secondary;
  OpalChannel *primary;
  int op_num;
  int chan_num;
  uint16_t chan;
  uint numchans;
  uint uStack_18;
  uint8_t mask;
  uint ui;
  int i;
  uint8_t val_local;
  uint16_t reg_num_local;
  Opal *self_local;
  
  uVar1 = reg_num & 0xe0;
  if (reg_num == 0xbd) {
    self->TremoloDepth = (uint)((val & 0x80) != 0);
    self->VibratoDepth = (uint)((val & 0x40) != 0);
  }
  else if (uVar1 == 0) {
    if (reg_num == 0x104) {
      chan._1_1_ = 1;
      for (uStack_18 = 0; (int)uStack_18 < 6; uStack_18 = uStack_18 + 1) {
        if ((int)uStack_18 < 3) {
          local_6c = uStack_18;
        }
        else {
          local_6c = uStack_18 + 6;
        }
        self_01 = self->Chan + (int)((local_6c & 0xffff) + 3);
        if ((val & chan._1_1_) == 0) {
          OpalChannel_SetChannelPair(self->Chan + (ushort)local_6c,(OpalChannel *)0x0);
          OpalChannel_SetEnable(self_01,1);
        }
        else {
          OpalChannel_SetChannelPair(self->Chan + (ushort)local_6c,self_01);
          OpalChannel_SetEnable(self_01,0);
        }
        chan._1_1_ = chan._1_1_ << 1;
      }
    }
    else if (reg_num == 8) {
      self->NoteSel = (uint)((val & 0x40) != 0);
      for (uStack_18 = 0; (int)uStack_18 < 0x12; uStack_18 = uStack_18 + 1) {
        OpalChannel_ComputeKeyScaleNumber(self->Chan + (int)uStack_18);
      }
    }
  }
  else if ((uVar1 < 0xa0) || (0xc0 < uVar1)) {
    if ((((0x1f < uVar1) && (uVar1 < 0x81)) || (uVar1 == 0xe0)) &&
       (primary._0_4_ = op_lookup[(int)(reg_num & 0x1f)], -1 < (int)primary)) {
      if ((reg_num & 0x100) != 0) {
        primary._0_4_ = (int)primary + 0x12;
      }
      self_00 = self->Op + (int)primary;
      if (uVar1 == 0x20) {
        OpalOperator_SetTremoloEnable(self_00,(uint)((val & 0x80) != 0));
        OpalOperator_SetVibratoEnable(self_00,(uint)((val & 0x40) != 0));
        OpalOperator_SetSustainMode(self_00,(uint)((val & 0x20) != 0));
        OpalOperator_SetEnvelopeScaling(self_00,(uint)((val & 0x10) != 0));
        OpalOperator_SetFrequencyMultiplier(self_00,val & 0xf);
      }
      else if (uVar1 == 0x40) {
        OpalOperator_SetKeyScale(self_00,(uint16_t)((int)(uint)val >> 6));
        OpalOperator_SetOutputLevel(self_00,val & 0x3f);
      }
      else if (uVar1 == 0x60) {
        OpalOperator_SetAttackRate(self_00,(uint16_t)((int)(uint)val >> 4));
        OpalOperator_SetDecayRate(self_00,val & 0xf);
      }
      else if (uVar1 == 0x80) {
        OpalOperator_SetSustainLevel(self_00,(uint16_t)((int)(uint)val >> 4));
        OpalOperator_SetReleaseRate(self_00,val & 0xf);
      }
      else if (uVar1 == 0xe0) {
        OpalOperator_SetWaveform(self_00,val & 7);
      }
    }
  }
  else {
    primary._4_4_ = reg_num & 0xf;
    if (primary._4_4_ < 9) {
      if ((reg_num & 0x100) != 0) {
        primary._4_4_ = primary._4_4_ + 9;
      }
      pOStack_58 = self->Chan + (int)primary._4_4_;
      chans[1] = pOStack_58;
      chans[0] = OpalChannel_GetChannelPair(pOStack_58);
      uVar2 = 2 - (chans[0] == (OpalChannel *)0x0);
      uVar1 = reg_num & 0xf0;
      if (uVar1 == 0xa0) {
        for (numchans = 0; numchans < uVar2; numchans = numchans + 1) {
          OpalChannel_SetFrequencyLow
                    (*(OpalChannel **)((long)&stack0xffffffffffffffa8 + (ulong)numchans * 8),
                     (ushort)val);
        }
      }
      else if (uVar1 == 0xb0) {
        for (numchans = 0; numchans < uVar2; numchans = numchans + 1) {
          OpalChannel_SetKeyOn
                    (*(OpalChannel **)((long)&stack0xffffffffffffffa8 + (ulong)numchans * 8),
                     (uint)((val & 0x20) != 0));
          OpalChannel_SetOctave
                    (*(OpalChannel **)((long)&stack0xffffffffffffffa8 + (ulong)numchans * 8),
                     (ushort)((int)(uint)val >> 2) & 7);
          OpalChannel_SetFrequencyHigh
                    (*(OpalChannel **)((long)&stack0xffffffffffffffa8 + (ulong)numchans * 8),val & 3
                    );
        }
      }
      else if (uVar1 == 0xc0) {
        OpalChannel_SetRightEnable(chans[1],(uint)((val & 0x20) != 0));
        OpalChannel_SetLeftEnable(chans[1],(uint)((val & 0x10) != 0));
        OpalChannel_SetFeedback(chans[1],(ushort)((int)(uint)val >> 1) & 7);
        OpalChannel_SetModulationType(chans[1],val & 1);
      }
    }
  }
  return;
}

Assistant:

void Opal_Port(Opal *self, uint16_t reg_num, uint8_t val)
{
    int i;
    unsigned ui;
    uint8_t mask;
    unsigned numchans;
    uint16_t chan;
    int chan_num;
    int op_num;
    OpalChannel *primary, *secondary, *cchan;
    OpalChannel* chans[2];
    uint16_t type = reg_num & 0xE0;
    OpalOperator *op;

    /* Is it BD, the one-off register stuck in the middle of the register array? */
    if(reg_num == 0xBD)
    {
        self->TremoloDepth = (val & 0x80) != 0;
        self->VibratoDepth = (val & 0x40) != 0;
        return;
    }

    /* Global registers */
    if(type == 0x00)
    {

        /* 4-OP enables*/
        if(reg_num == 0x104)
        {

            /* Enable/disable channels based on which 4-op enables */
            mask = 1;

            for(i = 0; i < 6; i++, mask <<= 1)
            {
                /* The 4-op channels are 0, 1, 2, 9, 10, 11 */
                chan = i < 3 ? i : i + 6;
                primary = &self->Chan[chan];
                secondary = &self->Chan[chan + 3];

                if(val & mask)
                {
                    /* Let primary channel know it's controlling the secondary channel */
                    OpalChannel_SetChannelPair(primary, secondary);

                    /* Turn off the second channel in the pair */
                    OpalChannel_SetEnable(secondary, OPAL_FALSE);

                }
                else
                {
                    /* Let primary channel know it's no longer controlling the secondary channel */
                    OpalChannel_SetChannelPair(primary, 0);

                    /* Turn on the second channel in the pair */
                    OpalChannel_SetEnable(secondary, OPAL_TRUE);
                }
            }

            /* CSW / Note-sel */
        }
        else if(reg_num == 0x08)
        {
            self->NoteSel = (val & 0x40) != 0;

            /* Get the channels to recompute the Key Scale No. as this varies based on NoteSel */
            for(i = 0; i < OpalNumChannels; i++)
                OpalChannel_ComputeKeyScaleNumber(&self->Chan[i]);
        }

        /* Channel registers */
    }
    else if(type >= 0xA0 && type <= 0xC0)
    {
        /* Convert to channel number */
        chan_num = reg_num & 15;

        /* Valid channel? */
        if(chan_num >= 9)
            return;

        /* Is it the other bank of channels? */
        if(reg_num & 0x100)
            chan_num += 9;

        cchan = &self->Chan[chan_num];

        /* libADLMIDI: registers Ax and Cx affect both channels */
        chans[0] = cchan;
        chans[1] = OpalChannel_GetChannelPair(cchan);
        numchans = chans[1] ? 2 : 1;

        /* Do specific registers */
        switch(reg_num & 0xF0)
        {

        /* Frequency low */
        case 0xA0:
        {
            for(ui = 0; ui < numchans; ++ui)    /* libADLMIDI */
            {
                OpalChannel_SetFrequencyLow(chans[ui], val);
            }

            break;
        }

        /* Key-on / Octave / Frequency High */
        case 0xB0:
        {
            for(ui = 0; ui < numchans; ++ui)    /* libADLMIDI */
            {
                OpalChannel_SetKeyOn(chans[ui],(val & 0x20) != 0);
                OpalChannel_SetOctave(chans[ui], val >> 2 & 7);
                OpalChannel_SetFrequencyHigh(chans[ui], val & 3);
            }

            break;
        }

        /* Right Stereo Channel Enable / Left Stereo Channel Enable / Feedback Factor / Modulation Type */
        case 0xC0:
        {
            OpalChannel_SetRightEnable(cchan, (val & 0x20) != 0);
            OpalChannel_SetLeftEnable(cchan, (val & 0x10) != 0);
            OpalChannel_SetFeedback(cchan, val >> 1 & 7);
            OpalChannel_SetModulationType(cchan, val & 1);
            break;
        }
        }

        /* Operator registers */
    }
    else if((type >= 0x20 && type <= 0x80) || type == 0xE0)
    {
        /* Convert to operator number */
        op_num = op_lookup[reg_num & 0x1F];

        /* Valid register? */
        if(op_num < 0)
            return;

        /* Is it the other bank of operators? */
        if(reg_num & 0x100)
            op_num += 18;

        op = &self->Op[op_num];

        /* Do specific registers */
        switch(type)
        {

        /* Tremolo Enable / Vibrato Enable / Sustain Mode / Envelope Scaling / Frequency Multiplier */
        case 0x20:
        {
            OpalOperator_SetTremoloEnable(op, (val & 0x80) != 0);
            OpalOperator_SetVibratoEnable(op, (val & 0x40) != 0);
            OpalOperator_SetSustainMode(op, (val & 0x20) != 0);
            OpalOperator_SetEnvelopeScaling(op, (val & 0x10) != 0);
            OpalOperator_SetFrequencyMultiplier(op, val & 15);
            break;
        }

        /* Key Scale / Output Level */
        case 0x40:
        {
            OpalOperator_SetKeyScale(op, val >> 6);
            OpalOperator_SetOutputLevel(op, val & 0x3F);
            break;
        }

        /* Attack Rate / Decay Rate */
        case 0x60:
        {
            OpalOperator_SetAttackRate(op, val >> 4);
            OpalOperator_SetDecayRate(op, val & 15);
            break;
        }

        /* Sustain Level / Release Rate */
        case 0x80:
        {
            OpalOperator_SetSustainLevel(op, val >> 4);
            OpalOperator_SetReleaseRate(op, val & 15);
            break;
        }

        /* Waveform */
        case 0xE0:
        {
            OpalOperator_SetWaveform(op, val & 7);
            break;
        }
        }
    }
}